

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void ComputeConfigCRC(void)

{
  ostream oVar1;
  code cVar2;
  size_t i;
  long lVar3;
  ostream *poVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  uint bnum;
  long lVar8;
  quadlet_t model_desc [5];
  quadlet_t root_dir [5];
  quadlet_t bus_info [4];
  quadlet_t vendor_desc [4];
  
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  lVar6 = 0xe;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    // Version: ",0x10);
    pcVar7 = "Firewire";
    if (lVar6 == 0xe) {
      pcVar7 = "Ethernet";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    always @(*)",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    begin",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"        case (board_id)",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    lVar8 = 0;
    do {
      lVar3 = 0;
      do {
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"            4\'h",0xf);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": info_crc = 16\'h",0x11);
      lVar3 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 4;
      lVar3 = *(long *)(lVar3 + -0x18);
      poVar5 = poVar4 + lVar3;
      if (poVar4[lVar3 + 0xe1] == (ostream)0x0) {
        oVar1 = (ostream)std::ios::widen((char)poVar5);
        poVar5[0xe0] = oVar1;
        poVar5[0xe1] = (ostream)0x1;
      }
      poVar5[0xe0] = (ostream)0x30;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        endcase",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    end",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Root Directory CRC (Rev 1,2): ",0x22);
  lVar6 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar6 = *(long *)(lVar6 + -0x18);
  if ((&DAT_0012e2c1)[lVar6] == '\0') {
    cVar2 = (code)std::ios::widen((char)lVar6 + -0x20);
    setsockopt[lVar6] = cVar2;
    (&DAT_0012e2c1)[lVar6] = 1;
  }
  setsockopt[lVar6] = (code)0x30;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Vendor Descriptor CRC: ",0x1b);
  lVar6 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar6 = *(long *)(lVar6 + -0x18);
  if ((&DAT_0012e2c1)[lVar6] == '\0') {
    cVar2 = (code)std::ios::widen((char)lVar6 + -0x20);
    setsockopt[lVar6] = cVar2;
    (&DAT_0012e2c1)[lVar6] = 1;
  }
  setsockopt[lVar6] = (code)0x30;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  lVar6 = 0;
  do {
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    Model Descriptor CRC (Rev 1,2): ",0x24);
  lVar6 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  lVar6 = *(long *)(lVar6 + -0x18);
  if ((&DAT_0012e2c1)[lVar6] == '\0') {
    cVar2 = (code)std::ios::widen((char)lVar6 + -0x20);
    setsockopt[lVar6] = cVar2;
    (&DAT_0012e2c1)[lVar6] = 1;
  }
  setsockopt[lVar6] = (code)0x30;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  return;
}

Assistant:

void ComputeConfigCRC()
{
    uint16_t crc16, crc16Eth;
    quadlet_t bus_info[4];
    bus_info[0] = bswap_32(0x31333934);  // "1394"
    bus_info[1] = bswap_32(0x00ffa000);
    bus_info[2] = bswap_32(0xfa610e00);  // LCSR CID + BID + E/F
    bus_info[3] = bswap_32(0x00000007);  // Firmware version
    std::cout << std::hex;
    for (unsigned int bver = 0x0e; bver <= 0x0f; bver++) {
        std::cout << "    // Version: " << ((bver == 0x0e) ? "Ethernet" : "Firewire") << std::endl;
        std::cout << "    always @(*)" << std::endl;
        std::cout << "    begin" << std::endl;
        std::cout << "        case (board_id)" << std::endl;
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            bus_info[2] = bswap_32(0xfa610e00|(bnum << 4)|bver);
            crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(bus_info), sizeof(bus_info));
            std::cout << "            4'h" << bnum << ": info_crc = 16'h"
                      << std::setw(4) << std::setfill('0') << crc16 << ";" << std::endl;
        }
        std::cout << "        endcase" << std::endl;
        std::cout << "    end" << std::endl;
    }
    quadlet_t root_dir[5];
    root_dir[0] = bswap_32(0x0c0083c0);
    root_dir[1] = bswap_32(0x03fa610e);
    root_dir[2] = bswap_32(0x81000003);
    root_dir[3] = bswap_32(0x17000001);
    root_dir[4] = bswap_32(0x81000006);
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    root_dir[3] = bswap_32(0x17000002);
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    std::cout << "    Root Directory CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    quadlet_t vendor_desc[4];
    vendor_desc[0] = bswap_32(0x00000000);
    vendor_desc[1] = bswap_32(0x00000000);
    vendor_desc[2] = bswap_32(0x4A485520);  // "JHU "
    vendor_desc[3] = bswap_32(0x4C435352);  // "LCSR"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(vendor_desc), sizeof(vendor_desc));
    std::cout << "    Vendor Descriptor CRC: " << std::setw(4) << std::setfill('0') << crc16
              << std::endl;
    quadlet_t model_desc[5];
    model_desc[0] = bswap_32(0x00000000);
    model_desc[1] = bswap_32(0x00000000);
    model_desc[2] = bswap_32(0x46504741);   // "FPGA"
    model_desc[3] = bswap_32(0x312F514C);   // "1/QL"
    model_desc[4] = bswap_32(0x41000000);   // "A"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    model_desc[3] = bswap_32(0x322F514C);   // "2/QL"
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    std::cout << "    Model Descriptor CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    std::cout << std::dec;
}